

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

void __thiscall
rr::FragmentProcessor::executeDepthWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,PixelBufferAccess *depthBuffer)

{
  int y;
  int z;
  Fragment *this_00;
  float depth;
  float clampedDepth;
  Fragment *frag;
  int fragSampleNdx;
  int regSampleNdx;
  PixelBufferAccess *depthBuffer_local;
  Fragment *inputFragments_local;
  int numSamplesPerFragment_local;
  int fragNdxOffset_local;
  FragmentProcessor *this_local;
  
  for (frag._4_4_ = 0; frag._4_4_ < 0x40; frag._4_4_ = frag._4_4_ + 1) {
    if (((this->m_sampleRegister[frag._4_4_].isAlive & 1U) != 0) &&
       ((this->m_sampleRegister[frag._4_4_].depthPassed & 1U) != 0)) {
      this_00 = inputFragments + (fragNdxOffset + frag._4_4_ / numSamplesPerFragment);
      depth = de::clamp<float>(this_00->sampleDepths[frag._4_4_ % numSamplesPerFragment],0.0,1.0);
      y = tcu::Vector<int,_2>::x(&this_00->pixelCoord);
      z = tcu::Vector<int,_2>::y(&this_00->pixelCoord);
      tcu::PixelBufferAccess::setPixDepth(depthBuffer,depth,frag._4_4_ % numSamplesPerFragment,y,z);
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeDepthWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const tcu::PixelBufferAccess& depthBuffer)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive && m_sampleRegister[regSampleNdx].depthPassed)
		{
			int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			const float			clampedDepth	= de::clamp(frag.sampleDepths[fragSampleNdx], 0.0f, 1.0f);

			depthBuffer.setPixDepth(clampedDepth, fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
		}
	}
}